

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O2

uint __thiscall
Indexing::HashingClauseVariantIndex::computeHash
          (HashingClauseVariantIndex *this,Literal **lits,uint length)

{
  uchar *puVar1;
  undefined1 auVar2 [12];
  bool bVar3;
  uint hash;
  int iVar4;
  ulong uVar5;
  IteratorBase local_48;
  
  if (computeHash(Kernel::Literal_const**,unsigned_int)::litOrder == '\0') {
    iVar4 = __cxa_guard_acquire(&computeHash(Kernel::Literal_const**,unsigned_int)::litOrder);
    if (iVar4 != 0) {
      computeHash::litOrder._cursor = (uint *)0x0;
      computeHash::litOrder._end = (uint *)0x0;
      computeHash::litOrder._capacity = 0;
      computeHash::litOrder._stack = (uint *)0x0;
      __cxa_atexit(Lib::Stack<unsigned_int>::~Stack,&computeHash::litOrder,&__dso_handle);
      __cxa_guard_release(&computeHash(Kernel::Literal_const**,unsigned_int)::litOrder);
    }
  }
  computeHash::litOrder._cursor = computeHash::litOrder._stack;
  auVar2._4_8_ = 0;
  auVar2._0_4_ = length;
  Lib::Stack<unsigned_int>::loadFromIterator<Lib::RangeIterator<unsigned_int>>
            (&computeHash::litOrder,(RangeIterator<unsigned_int>)(auVar2 << 0x40));
  std::
  __sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<Indexing::HashingClauseVariantIndex::VariableIgnoringComparator>>
            (computeHash::litOrder._stack,computeHash::litOrder._cursor,
             (_Iter_comp_iter<Indexing::HashingClauseVariantIndex::VariableIgnoringComparator>)lits)
  ;
  if (computeHash(Kernel::Literal_const**,unsigned_int)::varCnts == '\0') {
    iVar4 = __cxa_guard_acquire(&computeHash(Kernel::Literal_const**,unsigned_int)::varCnts);
    if (iVar4 != 0) {
      computeHash::varCnts._timestamp = 1;
      computeHash::varCnts._size = 0;
      computeHash::varCnts._deleted = 0;
      computeHash::varCnts._capacityIndex = 0;
      computeHash::varCnts._capacity = 0;
      computeHash::varCnts._nextExpansionOccupancy = 0;
      computeHash::varCnts._entries._0_4_ = 0;
      computeHash::varCnts._entries._4_4_ = 0;
      computeHash::varCnts._afterLast._0_4_ = 0;
      computeHash::varCnts._afterLast._4_4_ = 0;
      __cxa_atexit(Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::
                   ~DHMap,&computeHash::varCnts,&__dso_handle);
      __cxa_guard_release(&computeHash(Kernel::Literal_const**,unsigned_int)::varCnts);
    }
  }
  Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&computeHash::varCnts);
  hash = 0x811c9dc5;
  for (uVar5 = 0; length != uVar5; uVar5 = uVar5 + 1) {
    hash = computeHashAndCountVariables
                     (this,lits[computeHash::litOrder._stack[uVar5]],&computeHash::varCnts,hash);
  }
  if (computeHash::varCnts._size != 0) {
    if (computeHash(Kernel::Literal_const**,unsigned_int)::varCntHistogram == '\0') {
      iVar4 = __cxa_guard_acquire(&computeHash(Kernel::Literal_const**,unsigned_int)::
                                   varCntHistogram);
      if (iVar4 != 0) {
        computeHash::varCntHistogram._cursor = (uchar *)0x0;
        computeHash::varCntHistogram._end = (uchar *)0x0;
        computeHash::varCntHistogram._capacity = 0;
        computeHash::varCntHistogram._stack = (uchar *)0x0;
        __cxa_atexit(Lib::Stack<unsigned_char>::~Stack,&computeHash::varCntHistogram,&__dso_handle);
        __cxa_guard_release(&computeHash(Kernel::Literal_const**,unsigned_int)::varCntHistogram);
      }
    }
    computeHash::varCntHistogram._cursor = computeHash::varCntHistogram._stack;
    local_48._next =
         (Entry *)CONCAT44(computeHash::varCnts._entries._4_4_,computeHash::varCnts._entries._0_4_);
    local_48._last =
         (Entry *)CONCAT44(computeHash::varCnts._afterLast._4_4_,
                           computeHash::varCnts._afterLast._0_4_);
    local_48._timestamp = computeHash::varCnts._timestamp;
    while( true ) {
      bVar3 = Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::
              IteratorBase::hasNext(&local_48);
      if (!bVar3) break;
      puVar1 = &(local_48._next)->_val;
      local_48._next = local_48._next + 1;
      Lib::Stack<unsigned_char>::push(&computeHash::varCntHistogram,*puVar1);
    }
    std::__sort<unsigned_char*,__gnu_cxx::__ops::_Iter_less_iter>
              (computeHash::varCntHistogram._stack,computeHash::varCntHistogram._cursor);
    hash = Lib::StackHash<Lib::DefaultHash>::hash<unsigned_char>(&computeHash::varCntHistogram,hash)
    ;
  }
  return hash;
}

Assistant:

unsigned HashingClauseVariantIndex::computeHash(Literal* const * lits, unsigned length)
{
  // cout << "length " <<  length << endl;

  TIME_TRACE("hvci compute hash");

  static Stack<unsigned> litOrder;
  litOrder.reset();
  litOrder.loadFromIterator(getRangeIterator(0u,length));

  std::sort(litOrder.begin(), litOrder.end(), VariableIgnoringComparator(lits));

  static VarCounts varCnts;
  varCnts.reset();

  unsigned hash = 2166136261u;
  for(unsigned i=0; i<length; i++) {
    unsigned li = litOrder[i];
    hash = computeHashAndCountVariables(lits[li],varCnts,hash);
  }

  if (varCnts.size() > 0) {
    static Stack<unsigned char> varCntHistogram;
    varCntHistogram.reset();
    VarCounts::Iterator it(varCnts);
    while (it.hasNext()) {
      varCntHistogram.push(it.next());
    }

    std::sort(varCntHistogram.begin(),varCntHistogram.end());
    hash = DefaultHash::hash(varCntHistogram, hash);
  }

  return hash;
}